

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_safe_invert_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *Q,uchar inv)

{
  int iVar1;
  undefined1 local_40 [8];
  mbedtls_mpi mQY;
  int local_20;
  uchar nonzero;
  int ret;
  uchar inv_local;
  mbedtls_ecp_point *Q_local;
  mbedtls_ecp_group *grp_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)local_40);
  local_20 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_40,&grp->P,&Q->Y);
  if (local_20 == 0) {
    iVar1 = mbedtls_mpi_cmp_int(&Q->Y,0);
    mQY.p._7_1_ = iVar1 != 0;
    local_20 = mbedtls_mpi_safe_cond_assign(&Q->Y,(mbedtls_mpi *)local_40,inv & mQY.p._7_1_);
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_40);
  return local_20;
}

Assistant:

static int ecp_safe_invert_jac( const mbedtls_ecp_group *grp,
                            mbedtls_ecp_point *Q,
                            unsigned char inv )
{
    int ret;
    unsigned char nonzero;
    mbedtls_mpi mQY;

    mbedtls_mpi_init( &mQY );

    /* Use the fact that -Q.Y mod P = P - Q.Y unless Q.Y == 0 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &mQY, &grp->P, &Q->Y ) );
    nonzero = mbedtls_mpi_cmp_int( &Q->Y, 0 ) != 0;
    MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_assign( &Q->Y, &mQY, inv & nonzero ) );

cleanup:
    mbedtls_mpi_free( &mQY );

    return( ret );
}